

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

void create_file(char *name)

{
  int iVar1;
  undefined8 uVar2;
  int64_t eval_b;
  int64_t eval_a;
  uv_fs_t req;
  
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&req,name,0x41,0x180,(uv_fs_cb)0x0);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    uv_fs_req_cleanup(&req);
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&req,(uv_os_fd_t)req.result,(uv_fs_cb)0x0);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      uv_fs_req_cleanup(&req);
      return;
    }
    uVar2 = 0x5a;
  }
  else {
    uVar2 = 0x56;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
          ,uVar2,"r","==","0",eval_a,"==",0);
  abort();
}

Assistant:

static void create_file(const char* name) {
  int r;
  uv_os_fd_t file;
  uv_fs_t req;

  r = uv_fs_open(NULL, &req, name, UV_FS_O_WRONLY | UV_FS_O_CREAT,
                 S_IWUSR | S_IRUSR,
                 NULL);
  ASSERT_OK(r);
  file = (uv_os_fd_t) req.result;
  uv_fs_req_cleanup(&req);
  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&req);
}